

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase181::run(TestCase181 *this)

{
  Builder builder_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  DebugComparison<int,_unsigned_int> _kjCondition_3;
  uint local_308;
  ushort uStack_304;
  undefined2 uStack_302;
  uint local_2ec;
  DebugComparison<int,_unsigned_long> _kjCondition_4;
  ulong local_2a8;
  char *pcStack_2a0;
  size_t local_298;
  undefined4 local_288;
  uint uStack_284;
  undefined4 uStack_280;
  ulong local_268;
  char *pcStack_260;
  char *local_258;
  DebugComparison<int,_unsigned_int> _kjCondition_2;
  uint local_228;
  ReaderFor<capnp::AnyList> readPtr;
  Builder local_1e8;
  Builder root;
  BuilderFor<capnp::AnyList> ptr;
  StructBuilder local_170;
  Builder b;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestAnyPointer>
            (&root,&builder.super_MessageBuilder);
  readPtr._reader.segment = &(root._builder.segment)->super_SegmentReader;
  readPtr._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  readPtr._reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::initAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            (&b,(Builder *)&readPtr,2);
  ListBuilder::getStructElement(&local_170,&b.builder,0);
  builder_00._builder.capTable = local_170.capTable;
  builder_00._builder.segment = local_170.segment;
  builder_00._builder.data = local_170.data;
  builder_00._builder.pointers = local_170.pointers;
  builder_00._builder.dataSize = local_170.dataSize;
  builder_00._builder.pointerCount = local_170.pointerCount;
  builder_00._builder._38_2_ = local_170._38_2_;
  initTestMessage(builder_00);
  readPtr._reader.segment = &(root._builder.segment)->super_SegmentReader;
  readPtr._reader.capTable = &(root._builder.capTable)->super_CapTableReader;
  readPtr._reader.ptr = (byte *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::AnyList>(&ptr,(Builder *)&readPtr);
  readPtr._reader.segment = (SegmentReader *)CONCAT44(ptr._builder.elementCount,2);
  readPtr._reader.capTable = (CapTableReader *)anon_var_dwarf_b08b;
  readPtr._reader.ptr = &DAT_00000005;
  readPtr._reader.elementCount._0_1_ = ptr._builder.elementCount == 2;
  if ((ptr._builder.elementCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_3.left = 2;
    _kjCondition_2.left = ptr._builder.elementCount;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbd,ERROR,
               "\"failed: expected \" \"(2) == (ptr.size())\", _kjCondition, 2, ptr.size()",
               (char (*) [37])"failed: expected (2) == (ptr.size())",
               (DebugComparison<int,_unsigned_int> *)&readPtr,&_kjCondition_3.left,
               (uint *)&_kjCondition_2);
  }
  _kjCondition_2.op.content.size_ = (size_t)ptr._builder.ptr;
  _kjCondition_2._24_4_ = ptr._builder.elementCount;
  _kjCondition_2._0_8_ = ptr._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)ptr._builder.capTable;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar5 = local_308 >> 3;
  readPtr._reader.capTable = (CapTableReader *)(ulong)uVar5;
  readPtr._reader.segment = (SegmentReader *)CONCAT44(readPtr._reader.segment._4_4_,0x30);
  readPtr._reader.ptr = " == ";
  readPtr._reader.elementCount = 5;
  readPtr._reader.step = 0;
  readPtr._reader.structDataSize = CONCAT31(readPtr._reader.structDataSize._1_3_,uVar5 == 0x30);
  if ((uVar5 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_268 = CONCAT44(local_268._4_4_,0x30);
    _kjCondition_2.op.content.size_ = (size_t)ptr._builder.ptr;
    _kjCondition_2._24_4_ = ptr._builder.elementCount;
    _kjCondition_2._0_8_ = ptr._builder.segment;
    _kjCondition_2.op.content.ptr = (char *)ptr._builder.capTable;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    _kjCondition_4._0_8_ = ZEXT48(local_308 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbe,ERROR,
               "\"failed: expected \" \"(48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, ptr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (ptr.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&readPtr,(int *)&local_268,
               (unsigned_long *)&_kjCondition_4);
  }
  local_308 = ptr._builder.structDataSize;
  uStack_304 = ptr._builder.structPointerCount;
  uStack_302 = ptr._builder._38_2_;
  _kjCondition_3.op.content.size_ = (size_t)ptr._builder.ptr;
  _kjCondition_3._24_4_ = ptr._builder.elementCount;
  _kjCondition_3._0_8_ = ptr._builder.segment;
  _kjCondition_3.op.content.ptr = (char *)ptr._builder.capTable;
  ListBuilder::getStructElement((StructBuilder *)&readPtr,(ListBuilder *)&_kjCondition_3,0);
  _kjCondition_2.right._0_2_ = readPtr._reader.structPointerCount;
  _kjCondition_2.left = 0x14;
  _kjCondition_2.right._2_2_ = 0;
  _kjCondition_2.op.content.ptr = " == ";
  _kjCondition_2.op.content.size_ = 5;
  _kjCondition_2.result = readPtr._reader.structPointerCount == 0x14;
  if ((readPtr._reader.structPointerCount != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_4.left = 0x14;
    local_308 = ptr._builder.structDataSize;
    uStack_304 = ptr._builder.structPointerCount;
    uStack_302 = ptr._builder._38_2_;
    _kjCondition_3.op.content.size_ = (size_t)ptr._builder.ptr;
    _kjCondition_3._24_4_ = ptr._builder.elementCount;
    _kjCondition_3._0_8_ = ptr._builder.segment;
    _kjCondition_3.op.content.ptr = (char *)ptr._builder.capTable;
    ListBuilder::getStructElement((StructBuilder *)&readPtr,(ListBuilder *)&_kjCondition_3,0);
    local_268 = CONCAT44(local_268._4_4_,(uint)readPtr._reader.structPointerCount);
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xbf,ERROR,
               "\"failed: expected \" \"(20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (ptr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,&_kjCondition_2,&_kjCondition_4.left,(uint *)&local_268);
  }
  uVar5 = local_308;
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  PointerBuilder::asReader((PointerBuilder *)&_kjCondition_2);
  AnyPointer::Reader::getAs<capnp::AnyList>(&readPtr,(Reader *)&_kjCondition_3);
  _kjCondition_3.right = readPtr._reader.elementCount;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  _kjCondition_3.result = readPtr._reader.elementCount == 2;
  if ((readPtr._reader.elementCount != 2) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = readPtr._reader.elementCount;
    kj::_::Debug::log<char_const(&)[41],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc3,ERROR,
               "\"failed: expected \" \"(2) == (readPtr.size())\", _kjCondition, 2, readPtr.size()",
               (char (*) [41])"failed: expected (2) == (readPtr.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
  _kjCondition_2._24_4_ = readPtr._reader.elementCount;
  _kjCondition_2._28_4_ = readPtr._reader.step;
  _kjCondition_2._0_8_ = readPtr._reader.segment;
  _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar6 = local_308 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar6;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar6 == 0x30;
  if ((uVar6 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8 = CONCAT44(local_2a8._4_4_,0x30);
    _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
    _kjCondition_2._24_4_ = readPtr._reader.elementCount;
    _kjCondition_2._28_4_ = readPtr._reader.step;
    _kjCondition_2._0_8_ = readPtr._reader.segment;
    _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_268 = (ulong)(local_308 >> 3);
    kj::_::Debug::
    log<char_const(&)[84],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc4,ERROR,
               "\"failed: expected \" \"(48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [84])
                "failed: expected (48) == (readPtr.as<List<AnyStruct>>()[0].getDataSection().size())"
               ,&_kjCondition_4,(int *)&local_2a8,&local_268);
  }
  local_228 = readPtr._reader.structDataSize;
  _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
  _kjCondition_2._24_4_ = readPtr._reader.elementCount;
  _kjCondition_2._28_4_ = readPtr._reader.step;
  _kjCondition_2._0_8_ = readPtr._reader.segment;
  _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  _kjCondition_4._4_2_ = uStack_304;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_268 = CONCAT44(local_268._4_4_,0x14);
    local_228 = readPtr._reader.structDataSize;
    _kjCondition_2.op.content.size_ = (size_t)readPtr._reader.ptr;
    _kjCondition_2._24_4_ = readPtr._reader.elementCount;
    _kjCondition_2._28_4_ = readPtr._reader.step;
    _kjCondition_2._0_8_ = readPtr._reader.segment;
    _kjCondition_2.op.content.ptr = (char *)readPtr._reader.capTable;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2a8 = CONCAT44(local_2a8._4_4_,(uint)uStack_304);
    kj::_::Debug::log<char_const(&)[87],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc5,ERROR,
               "\"failed: expected \" \"(20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [87])
                "failed: expected (20) == (readPtr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_268,
               (uint *)&local_2a8);
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &_kjCondition_3,(Builder *)&_kjCondition_2);
  uVar2 = _kjCondition_3._24_4_;
  local_258 = (char *)_kjCondition_3.op.content.size_;
  local_268._0_4_ = _kjCondition_3.left;
  local_268._4_4_ = _kjCondition_3.right;
  pcStack_260 = _kjCondition_3.op.content.ptr;
  uVar1._2_2_ = uStack_302;
  uVar1._0_2_ = uStack_304;
  _kjCondition_3.left = 2;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar8 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar8;
  if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar2;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
               (char (*) [37])"failed: expected (2) == (alb.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_4.op.content.ptr = local_258;
  _kjCondition_4._0_8_ = local_268;
  _kjCondition_4.right = (unsigned_long)pcStack_260;
  _kjCondition_3.result = SUB41(uVar2,0);
  _kjCondition_3._25_3_ = SUB43(uVar2,1);
  _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
  _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
  _kjCondition_4._32_4_ = local_308;
  _kjCondition_3._24_4_ = uVar3;
  _kjCondition_4._36_4_ = uVar1;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0);
  uVar7 = local_228 >> 3;
  _kjCondition_3.op.content.ptr = (char *)(ulong)uVar7;
  _kjCondition_3.left = 0x30;
  _kjCondition_3.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition_3.result = true;
  _kjCondition_3._25_3_ = 0;
  uVar3 = _kjCondition_3._24_4_;
  _kjCondition_3._28_4_ = 0;
  local_308 = CONCAT31(local_308._1_3_,uVar7 == 0x30);
  uVar6 = local_308;
  if ((uVar7 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_1e8.builder.segment = (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,0x30);
    _kjCondition_4.op.content.ptr = local_258;
    _kjCondition_4._0_8_ = local_268;
    _kjCondition_4.right = (unsigned_long)pcStack_260;
    _kjCondition_3.result = SUB41(uVar2,0);
    _kjCondition_3._25_3_ = SUB43(uVar2,1);
    _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
    _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
    _kjCondition_4._32_4_ = uVar5;
    _kjCondition_3._24_4_ = uVar3;
    _kjCondition_4._36_4_ = uVar1;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0)
    ;
    local_2a8 = (ulong)(local_228 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition_3,(int *)&local_1e8,&local_2a8);
  }
  uVar1 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = (size_t)local_258;
  _kjCondition_2.left = (undefined4)local_268;
  _kjCondition_2.right = local_268._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_260;
  _kjCondition_3.result = SUB41(uVar2,0);
  _kjCondition_3._25_3_ = SUB43(uVar2,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_3._24_4_ = uVar1;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar1 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8 = CONCAT44(local_2a8._4_4_,0x14);
    _kjCondition_2.op.content.size_ = (size_t)local_258;
    _kjCondition_2.left = (undefined4)local_268;
    _kjCondition_2.right = local_268._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_260;
    _kjCondition_3.result = SUB41(uVar2,0);
    _kjCondition_3._25_3_ = SUB43(uVar2,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_3._24_4_ = uVar1;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    local_1e8.builder.segment =
         (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,(uint)uStack_304);
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xca,ERROR,
               "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_2a8,
               (uint *)&local_1e8);
  }
  _kjCondition_2._0_8_ = root._builder.segment;
  _kjCondition_2.op.content.ptr = (char *)root._builder.capTable;
  _kjCondition_2.op.content.size_ = (size_t)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &_kjCondition_3,(Builder *)&_kjCondition_2);
  uVar3 = _kjCondition_3._28_4_;
  uVar1 = _kjCondition_3._24_4_;
  local_258 = (char *)_kjCondition_3.op.content.size_;
  local_268._0_4_ = _kjCondition_3.left;
  local_268._4_4_ = _kjCondition_3.right;
  pcStack_260 = _kjCondition_3.op.content.ptr;
  uVar2._2_2_ = uStack_302;
  uVar2._0_2_ = uStack_304;
  _kjCondition_3.left = 2;
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar8 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar8;
  if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xce,ERROR,
               "\"failed: expected \" \"(2) == (alb.size())\", _kjCondition, 2, alb.size()",
               (char (*) [37])"failed: expected (2) == (alb.size())",&_kjCondition_3,
               &_kjCondition_2.left,(uint *)&_kjCondition_4);
  }
  uVar4 = _kjCondition_3._24_4_;
  _kjCondition_4.op.content.ptr = local_258;
  _kjCondition_4._0_8_ = local_268;
  _kjCondition_4.right = (unsigned_long)pcStack_260;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
  _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
  _kjCondition_4.op.content.size_._4_4_ = uVar3;
  _kjCondition_4._32_4_ = local_308;
  _kjCondition_3._24_4_ = uVar4;
  _kjCondition_4._36_4_ = uVar2;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0);
  uVar7 = uVar5 >> 3;
  _kjCondition_3.op.content.ptr = (char *)(ulong)uVar7;
  _kjCondition_3.left = 0x30;
  _kjCondition_3.op.content.size_ = (size_t)anon_var_dwarf_b08b;
  _kjCondition_3.result = true;
  _kjCondition_3._25_3_ = 0;
  uVar4 = _kjCondition_3._24_4_;
  _kjCondition_3._28_4_ = 0;
  local_308 = CONCAT31(local_308._1_3_,uVar7 == 0x30);
  if ((uVar7 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_1e8.builder.segment = (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,0x30);
    _kjCondition_4.op.content.ptr = local_258;
    _kjCondition_4._0_8_ = local_268;
    _kjCondition_4.right = (unsigned_long)pcStack_260;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_4.op.content.size_._0_1_ = _kjCondition_3.result;
    _kjCondition_4.op.content.size_._1_3_ = _kjCondition_3._25_3_;
    _kjCondition_4.op.content.size_._4_4_ = uVar3;
    _kjCondition_4._32_4_ = uVar6;
    _kjCondition_3._24_4_ = uVar4;
    _kjCondition_4._36_4_ = uVar2;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_2,(ListBuilder *)&_kjCondition_4,0)
    ;
    local_2a8 = (ulong)(uVar5 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xcf,ERROR,
               "\"failed: expected \" \"(48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alb.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alb.as<List<AnyStruct>>()[0].getDataSection().size())",
               (DebugComparison<int,_unsigned_long> *)&_kjCondition_3,(int *)&local_1e8,&local_2a8);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = (size_t)local_258;
  _kjCondition_2.left = (undefined4)local_268;
  _kjCondition_2.right = local_268._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_260;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = uVar3;
  _kjCondition_3._24_4_ = uVar2;
  ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_2a8 = CONCAT44(local_2a8._4_4_,0x14);
    _kjCondition_2.op.content.size_ = (size_t)local_258;
    _kjCondition_2.left = (undefined4)local_268;
    _kjCondition_2.right = local_268._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_260;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = uVar3;
    _kjCondition_3._24_4_ = uVar2;
    ListBuilder::getStructElement((StructBuilder *)&_kjCondition_3,(ListBuilder *)&_kjCondition_2,0)
    ;
    local_1e8.builder.segment =
         (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,(uint)uStack_304);
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd0,ERROR,
               "\"failed: expected \" \"(20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alb.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alb.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_2a8,
               (uint *)&local_1e8);
  }
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.right = (unsigned_long)root._builder.capTable;
  _kjCondition_4.op.content.ptr = (char *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &_kjCondition_2,(Builder *)&_kjCondition_4);
  ListBuilder::asReader((ListBuilder *)&_kjCondition_2);
  uVar1 = _kjCondition_3._24_4_;
  local_298 = _kjCondition_3.op.content.size_;
  local_2a8._0_4_ = _kjCondition_3.left;
  local_2a8._4_4_ = _kjCondition_3.right;
  pcStack_2a0 = _kjCondition_3.op.content.ptr;
  local_288 = _kjCondition_3._28_4_;
  uStack_284 = local_308;
  uStack_280 = CONCAT22(uStack_302,uStack_304);
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar8 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar8;
  if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd4,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  uVar5 = local_308 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar5;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar5 == 0x30;
  if ((uVar5 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2ec = 0x30;
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_1e8.builder.segment = (SegmentBuilder *)(ulong)(local_308 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd5,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2ec,(unsigned_long *)&local_1e8);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_1e8.builder.segment = (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,0x14);
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2ec = (uint)uStack_304;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd6,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_1e8,&local_2ec);
  }
  local_1e8.builder.segment = root._builder.segment;
  local_1e8.builder.capTable = root._builder.capTable;
  local_1e8.builder.pointer = root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &_kjCondition_4,&local_1e8);
  _kjCondition_2.op.content.size_ = (size_t)_kjCondition_4.op.content.ptr;
  _kjCondition_2.result = _kjCondition_4.op.content.size_._0_1_;
  _kjCondition_2._25_3_ = _kjCondition_4.op.content.size_._1_3_;
  _kjCondition_2._28_4_ = _kjCondition_4.op.content.size_._4_4_;
  _kjCondition_2.left = _kjCondition_4.left;
  _kjCondition_2.right = _kjCondition_4._4_4_;
  _kjCondition_2.op.content.ptr = (char *)_kjCondition_4.right;
  ListBuilder::asReader((ListBuilder *)&_kjCondition_2);
  uVar1 = _kjCondition_3._24_4_;
  local_298 = _kjCondition_3.op.content.size_;
  local_2a8._0_4_ = _kjCondition_3.left;
  local_2a8._4_4_ = _kjCondition_3.right;
  pcStack_2a0 = _kjCondition_3.op.content.ptr;
  local_288 = _kjCondition_3._28_4_;
  uStack_284 = local_308;
  uStack_280 = CONCAT22(uStack_302,uStack_304);
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar8 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar8;
  if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xd9,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  uVar5 = local_308 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar5;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar5 == 0x30;
  if ((uVar5 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2ec = 0x30;
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_1e8.builder.segment = (SegmentBuilder *)(ulong)(local_308 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xda,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2ec,(unsigned_long *)&local_1e8);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_1e8.builder.segment = (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,0x14);
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2ec = (uint)uStack_304;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xdb,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_1e8,&local_2ec);
  }
  _kjCondition_4._0_8_ = root._builder.segment;
  _kjCondition_4.right = (unsigned_long)root._builder.capTable;
  _kjCondition_4.op.content.ptr = (char *)root._builder.pointers;
  AnyPointer::Builder::getAs<capnp::List<capnproto_test::capnp::test::TestAllTypes,(capnp::Kind)3>>
            ((BuilderFor<capnp::List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>_> *)
             &_kjCondition_2,(Builder *)&_kjCondition_4);
  ListBuilder::asReader((ListBuilder *)&_kjCondition_2);
  uVar1 = _kjCondition_3._24_4_;
  local_298 = _kjCondition_3.op.content.size_;
  local_2a8._0_4_ = _kjCondition_3.left;
  local_2a8._4_4_ = _kjCondition_3.right;
  pcStack_2a0 = _kjCondition_3.op.content.ptr;
  local_288 = _kjCondition_3._28_4_;
  uStack_284 = local_308;
  uStack_280 = CONCAT22(uStack_302,uStack_304);
  _kjCondition_3.right = _kjCondition_3._24_4_;
  _kjCondition_3.left = 2;
  _kjCondition_3.op.content.ptr = " == ";
  _kjCondition_3.op.content.size_ = 5;
  bVar8 = _kjCondition_3._24_4_ == 2;
  _kjCondition_3.result = bVar8;
  if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition_2.left = 2;
    _kjCondition_4.left = uVar1;
    kj::_::Debug::log<char_const(&)[37],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(2) == (alr.size())\", _kjCondition, 2, alr.size()",
               (char (*) [37])"failed: expected (2) == (alr.size())",&_kjCondition_3,
               (int *)&_kjCondition_2,(uint *)&_kjCondition_4);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  uVar5 = local_308 >> 3;
  _kjCondition_4.right = (unsigned_long)uVar5;
  _kjCondition_4.left = 0x30;
  _kjCondition_4.op.content.ptr = " == ";
  _kjCondition_4.op.content.size_._0_4_ = 5;
  _kjCondition_4.op.content.size_._4_4_ = 0;
  _kjCondition_4.result = uVar5 == 0x30;
  if ((uVar5 != 0x30) && (kj::_::Debug::minSeverity < 3)) {
    local_2ec = 0x30;
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_1e8.builder.segment = (SegmentBuilder *)(ulong)(local_308 >> 3);
    kj::_::Debug::
    log<char_const(&)[80],kj::_::DebugComparison<int,unsigned_long>&,int,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"(48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())\", _kjCondition, 48, alr.as<List<AnyStruct>>()[0].getDataSection().size()"
               ,(char (*) [80])
                "failed: expected (48) == (alr.as<List<AnyStruct>>()[0].getDataSection().size())",
               &_kjCondition_4,(int *)&local_2ec,(unsigned_long *)&local_1e8);
  }
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_2.op.content.size_ = local_298;
  _kjCondition_2.left = (undefined4)local_2a8;
  _kjCondition_2.right = local_2a8._4_4_;
  _kjCondition_2.op.content.ptr = pcStack_2a0;
  _kjCondition_3.result = SUB41(uVar1,0);
  _kjCondition_3._25_3_ = SUB43(uVar1,1);
  _kjCondition_2.result = _kjCondition_3.result;
  _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
  _kjCondition_2._28_4_ = local_288;
  _kjCondition_3._24_4_ = uVar2;
  ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
  uVar2 = _kjCondition_3._24_4_;
  _kjCondition_4.left = 0x14;
  _kjCondition_4._6_2_ = 0;
  _kjCondition_4.right = (unsigned_long)anon_var_dwarf_b08b;
  _kjCondition_4.op.content.ptr = &DAT_00000005;
  _kjCondition_4.op.content.size_._0_1_ = uStack_304 == 0x14;
  if ((uStack_304 != 0x14) && (kj::_::Debug::minSeverity < 3)) {
    local_1e8.builder.segment = (SegmentBuilder *)CONCAT44(local_1e8.builder.segment._4_4_,0x14);
    _kjCondition_2.op.content.size_ = local_298;
    _kjCondition_2.left = (undefined4)local_2a8;
    _kjCondition_2.right = local_2a8._4_4_;
    _kjCondition_2.op.content.ptr = pcStack_2a0;
    _kjCondition_3.result = SUB41(uVar1,0);
    _kjCondition_3._25_3_ = SUB43(uVar1,1);
    _kjCondition_2.result = _kjCondition_3.result;
    _kjCondition_2._25_3_ = _kjCondition_3._25_3_;
    _kjCondition_2._28_4_ = local_288;
    _kjCondition_3._24_4_ = uVar2;
    ListReader::getStructElement((StructReader *)&_kjCondition_3,(ListReader *)&_kjCondition_2,0);
    local_2ec = (uint)uStack_304;
    kj::_::Debug::log<char_const(&)[83],kj::_::DebugComparison<int,unsigned_int>&,int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())\", _kjCondition, 20, alr.as<List<AnyStruct>>()[0].getPointerSection().size()"
               ,(char (*) [83])
                "failed: expected (20) == (alr.as<List<AnyStruct>>()[0].getPointerSection().size())"
               ,(DebugComparison<int,_unsigned_int> *)&_kjCondition_4,(int *)&local_1e8,&local_2ec);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(Any, AnyList) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyPointer>();
  List<TestAllTypes>::Builder b = root.getAnyPointerField().initAs<List<TestAllTypes>>(2);
  initTestMessage(b[0]);

  auto ptr = root.getAnyPointerField().getAs<AnyList>();

  EXPECT_EQ(2, ptr.size());
  EXPECT_EQ(48, ptr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, ptr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto readPtr = root.getAnyPointerField().asReader().getAs<AnyList>();

  EXPECT_EQ(2, readPtr.size());
  EXPECT_EQ(48, readPtr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, readPtr.as<List<AnyStruct>>()[0].getPointerSection().size());

  auto alb = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>());
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alb = root.getAnyPointerField().getAs<List<TestAllTypes>>();
  EXPECT_EQ(2, alb.size());
  EXPECT_EQ(48, alb.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alb.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif

  auto alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader());
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

  alr = toAny(root.getAnyPointerField().getAs<List<TestAllTypes>>()).asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());

#if !_MSC_VER || defined(__clang__) // TODO(msvc): ICE on the necessary constructor; see any.h.
  alr = root.getAnyPointerField().getAs<List<TestAllTypes>>().asReader();
  EXPECT_EQ(2, alr.size());
  EXPECT_EQ(48, alr.as<List<AnyStruct>>()[0].getDataSection().size());
  EXPECT_EQ(20, alr.as<List<AnyStruct>>()[0].getPointerSection().size());
#endif
}